

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

uint __thiscall iqxmlrpc::http::Header::content_length(Header *this)

{
  bool bVar1;
  uint uVar2;
  Length_required *this_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"content-length",&local_39)
  ;
  bVar1 = option_exists(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"content-length",&local_39);
    uVar2 = get_option<unsigned_int>(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return uVar2;
  }
  this_00 = (Length_required *)__cxa_allocate_exception(0x50);
  Length_required::Length_required(this_00);
  __cxa_throw(this_00,&Length_required::typeinfo,Error_response::~Error_response);
}

Assistant:

unsigned Header::content_length() const
{
  if (!option_exists(names::content_length))
    throw Length_required();

  return get_unsigned(names::content_length);
}